

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::LegacyScriptPubKeyMan::TopUpInactiveHDChain
          (LegacyScriptPubKeyMan *this,CKeyID seed_id,int64_t index,bool internal)

{
  long lVar1;
  long lVar2;
  int iVar3;
  iterator iVar4;
  undefined4 extraout_var;
  pointer *__ptr;
  long lVar6;
  long in_FS_OFFSET;
  WalletBatch local_48;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  WalletDatabase *pWVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock4,&(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore
             ,"cs_KeyStore",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x148,false);
  iVar4 = std::
          _Hashtable<CKeyID,_std::pair<const_CKeyID,_wallet::CHDChain>,_std::allocator<std::pair<const_CKeyID,_wallet::CHDChain>_>,_std::__detail::_Select1st,_std::equal_to<CKeyID>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->super_LegacyDataSPKM).m_inactive_hd_chains._M_h,&seed_id);
  if (iVar4.super__Node_iterator_base<std::pair<const_CKeyID,_wallet::CHDChain>,_true>._M_cur !=
      (__node_type *)0x0) {
    lVar2 = *(long *)((long)iVar4.
                            super__Node_iterator_base<std::pair<const_CKeyID,_wallet::CHDChain>,_true>
                            ._M_cur + 0x40 + (ulong)internal * 8);
    lVar6 = index + 1;
    if (index + 1 < lVar2) {
      lVar6 = lVar2;
    }
    *(long *)((long)iVar4.super__Node_iterator_base<std::pair<const_CKeyID,_wallet::CHDChain>,_true>
                    ._M_cur + 0x40 + (ulong)internal * 8) = lVar6;
    iVar3 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3]
            )();
    pWVar5 = (WalletDatabase *)CONCAT44(extraout_var,iVar3);
    (*pWVar5->_vptr_WalletDatabase[0xe])(&local_48,pWVar5,1);
    local_48.m_database = pWVar5;
    TopUpChain(this,&local_48,
               (CHDChain *)
               ((long)iVar4.
                      super__Node_iterator_base<std::pair<const_CKeyID,_wallet::CHDChain>,_true>.
                      _M_cur + 0x20),0);
    if (local_48.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
      (*(*(_func_int ***)
          local_48.m_batch._M_t.
          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
          _M_t.
          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock4.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar4.super__Node_iterator_base<std::pair<const_CKeyID,_wallet::CHDChain>,_true>._M_cur
           != (__node_type *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::TopUpInactiveHDChain(const CKeyID seed_id, int64_t index, bool internal)
{
    LOCK(cs_KeyStore);

    auto it = m_inactive_hd_chains.find(seed_id);
    if (it == m_inactive_hd_chains.end()) {
        return false;
    }

    CHDChain& chain = it->second;

    if (internal) {
        chain.m_next_internal_index = std::max(chain.m_next_internal_index, index + 1);
    } else {
        chain.m_next_external_index = std::max(chain.m_next_external_index, index + 1);
    }

    WalletBatch batch(m_storage.GetDatabase());
    TopUpChain(batch, chain, 0);

    return true;
}